

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BasicCommands.c
# Opt level: O0

void test_CmdUserCmd(void)

{
  XcpLight_self.session_status = XcpLight_self.session_status | 2;
  XcpLight_self.protection_status = '\0';
  cmdMsg.length = 1;
  cmdMsg.payload[0] = 0xf1;
  XcpLight_processCommand(&cmdMsg);
  UnityAssertEqualNumber
            (1,(ulong)(reply_msg.length & 0xff),(char *)0x0,0xa1,UNITY_DISPLAY_STYLE_UINT8);
  UnityAssertEqualNumber
            (0x1a,(ulong)reply_msg.payload[0],(char *)0x0,0xa2,UNITY_DISPLAY_STYLE_UINT8);
  return;
}

Assistant:

void test_CmdUserCmd(void)
{
  SET_SESSION_CONNECTED();
  SET_UNLOCK_ALL_RESOURCES();
  cmdMsg.length = 1u;
  cmdMsg.payload[0] = XCP_CMD_USER_CMD;

  XcpLight_processCommand(&cmdMsg);

  TEST_ASSERT_EQUAL_UINT8(  1u, reply_msg.length);
  TEST_ASSERT_EQUAL_UINT8(0x1A, reply_msg.payload[0]);
}